

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void jacobi_ss_compute(int order,double alpha,double beta,double *xtab,double *weight)

{
  double *c;
  long lVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  undefined4 in_register_0000003c;
  ulong uVar5;
  int iVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_d8;
  double dp2;
  double p1;
  ulong local_c0;
  double local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  double *local_98;
  double *local_90;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  double *local_68;
  ulong local_60;
  double local_58;
  ulong uStack_50;
  undefined8 local_48;
  double local_40;
  double local_38;
  double x;
  
  local_48 = CONCAT44(in_register_0000003c,order);
  local_88._8_4_ = in_XMM0_Dc;
  local_88._0_8_ = alpha;
  local_88._12_4_ = in_XMM0_Dd;
  local_98 = weight;
  if (alpha <= -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SS_COMPUTE - Fatal error!\n");
    pcVar4 = "  -1.0 < ALPHA is required.\n";
  }
  else {
    local_90 = xtab;
    local_40 = beta;
    if (-1.0 < beta) {
      local_60 = (ulong)(uint)order;
      iVar6 = 0;
      uVar3 = 0xffffffffffffffff;
      if (-1 < order) {
        uVar3 = local_60 * 8;
      }
      uVar5 = 0;
      if (0 < order) {
        uVar5 = (ulong)(uint)order;
      }
      local_68 = (double *)operator_new__(uVar3);
      c = (double *)operator_new__(uVar3);
      local_78 = (double)local_88._0_8_ + local_40;
      for (uVar3 = 0; (uint)((int)uVar5 * 2) != uVar3; uVar3 = uVar3 + 2) {
        dVar8 = 0.0;
        iVar2 = (int)uVar3;
        if (local_78 != 0.0 && local_40 - (double)local_88._0_8_ != 0.0) {
          dVar8 = (local_78 * (local_40 - (double)local_88._0_8_)) /
                  (((double)iVar2 + local_78) * ((double)(iVar2 + 2) + local_78));
        }
        *(double *)((long)local_68 + uVar3 * 4) = dVar8;
        if (uVar3 == 0) {
          *c = 0.0;
        }
        else {
          dVar8 = (double)iVar6;
          *(double *)((long)c + uVar3 * 4) =
               ((dVar8 + local_40) * (dVar8 + (double)local_88._0_8_) * dVar8 * 4.0 *
               (local_78 + dVar8)) /
               (((double)(iVar2 + -1) + local_78) *
               ((double)iVar2 + local_78) * ((double)iVar2 + local_78) *
               ((double)(iVar2 + 1) + local_78));
        }
        iVar6 = iVar6 + 1;
      }
      local_a8._8_4_ = local_88._8_4_;
      local_a8._0_8_ = (double)local_88._0_8_ + 1.0;
      local_a8._12_4_ = local_88._12_4_;
      uStack_70 = local_88._8_8_;
      local_58 = lgamma((double)local_88._0_8_ + 1.0);
      dVar8 = lgamma(local_40 + 1.0);
      local_58 = dVar8 + local_58;
      dVar8 = lgamma(local_78 + 2.0);
      local_58 = exp(local_58 - dVar8);
      dVar8 = 1.0;
      for (lVar1 = 2; lVar1 <= (int)local_48; lVar1 = lVar1 + 1) {
        dVar8 = dVar8 * c[lVar1 + -1];
      }
      dVar9 = local_78 + 1.0;
      local_78 = dVar8;
      dVar8 = exp2(dVar9);
      local_78 = local_78 * local_58 * dVar8;
      iVar6 = (int)local_48;
      dVar8 = (double)iVar6;
      dVar9 = ((dVar8 + -8.0) * 0.22) / dVar8 + 1.0;
      dVar7 = (double)(iVar6 * iVar6);
      uStack_50 = local_88._8_8_ ^ 0x8000000000000000;
      local_58 = (-((double)local_88._0_8_ * 0.28 + 1.67) / ((double)local_88._0_8_ * 0.37 + 1.0)) *
                 dVar9 * ((local_40 * 8.0) / ((local_40 + 6.28) * dVar7) + 1.0);
      dVar16 = (double)local_88._0_8_ + 4.1;
      dVar14 = (double)local_88._0_8_ * 0.12;
      dVar12 = local_40 * 0.012;
      dVar15 = ABS((double)local_88._0_8_);
      dVar13 = ((double)local_88._0_8_ * 0.156 + 1.0) * (double)local_a8._0_8_;
      dVar10 = (double)local_88._0_8_ / dVar8;
      dVar11 = dVar10 * 0.83 * (local_40 / dVar8) +
               dVar10 * 0.452 * dVar10 + (local_40 / dVar8) * 0.96 + dVar10 * 1.48 + 1.0;
      local_a8._8_8_ = local_88._8_8_;
      local_a8._0_8_ =
           (dVar11 - ((dVar10 * 0.768) / dVar8 + 2.78 / (double)(iVar6 * iVar6 + 4)) *
                     (double)local_a8._0_8_) / dVar11;
      local_c0 = (ulong)(iVar6 - 1U);
      local_b0 = (1.0 / (((double)local_88._0_8_ * 8.0) / (((double)local_88._0_8_ + 6.28) * dVar7)
                        + 1.0)) *
                 (1.0 / dVar9) * ((local_40 * 0.37 + 1.0) / (local_40 * 0.28 + 1.67));
      dVar9 = (1.0 / (((dVar8 + -4.0) * 0.639) / ((dVar8 + -4.0) * 0.71 + 1.0) + 1.0)) *
              ((local_40 * 0.235 + 1.0) / (local_40 * 0.119 + 0.766));
      local_b8 = (1.0 / (((double)local_88._0_8_ * 20.0) / (((double)local_88._0_8_ + 7.5) * dVar7)
                        + 1.0)) * dVar9;
      p1 = (double)(long)(int)(iVar6 - 1U);
      uVar3 = 1;
      do {
        if (uVar3 - uVar5 == 1) {
          r8vec_reverse((int)local_60,local_90);
          r8vec_reverse((int)local_48,local_98);
          operator_delete__(local_68);
          operator_delete__(c);
          return;
        }
        iVar6 = (int)uVar3;
        if (iVar6 == 3) {
          local_38 = (*local_90 - dVar9) * local_58 + dVar9;
        }
        else {
          if (iVar6 == 2) {
            local_38 = (1.0 - dVar9) *
                       (-dVar16 / dVar13) * (((dVar14 + 1.0) * (dVar8 + -8.0) * 0.06) / dVar8 + 1.0)
                       * (((dVar15 * 0.25 + 1.0) * dVar12) / dVar8 + 1.0);
            goto LAB_001e2c9d;
          }
          if (iVar6 == 1) {
            local_38 = (double)local_a8._0_8_;
          }
          else if ((long)uVar3 < (long)p1) {
            local_38 = local_90[uVar3 - 2] * 3.0 + local_90[uVar3 - 3] * -3.0 + local_90[uVar3 - 4];
          }
          else {
            if (local_c0 == uVar3) {
              local_38 = (dVar9 - local_90[local_c0 - 3]) * local_b8;
            }
            else {
              if (local_60 != uVar3) goto LAB_001e2cf8;
              local_38 = (dVar9 - local_90[local_60 - 3]) * local_b0;
            }
LAB_001e2c9d:
            local_38 = local_38 + dVar9;
          }
        }
LAB_001e2cf8:
        jacobi_ss_root(&local_38,(int)local_48,(double)local_88._0_8_,local_40,&local_d8,&dp2,
                       local_68,c);
        local_90[uVar3 - 1] = local_38;
        local_98[uVar3 - 1] = local_78 / (local_d8 * dp2);
        uVar3 = uVar3 + 1;
        dVar9 = local_38;
      } while( true );
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SS_COMPUTE - Fatal error!\n");
    pcVar4 = "  -1.0 < BETA is required.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar4);
  exit(1);
}

Assistant:

void jacobi_ss_compute ( int order, double alpha, double beta, double xtab[], 
  double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SS_COMPUTE computes a Gauss-Jacobi quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) (1-X)**ALPHA * (1+X)**BETA * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//    Thanks to Xu Xiang of Fudan University for pointing out that
//    an earlier implementation of this routine was incorrect!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 May 2007
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.  For simple Gauss-Legendre quadrature,
//    set ALPHA = BETA = 0.0.  -1.0 < ALPHA and -1.0 < BETA are required.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double an;
  double *b;
  double bn;
  double *c;
  double cc;
  double delta;
  double dp2;
  int i;
  double p1;
  double prod;
  double r1;
  double r2;
  double r3;
  double x;
//
//  Check ALPHA and BETA.
//
  if ( alpha <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SS_COMPUTE - Fatal error!\n";
    std::cerr << "  -1.0 < ALPHA is required.\n";
    exit ( 1 );
  }

  if ( beta <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SS_COMPUTE - Fatal error!\n";
    std::cerr << "  -1.0 < BETA is required.\n";
    exit ( 1 );
  }

  b = new double[order];
  c = new double[order];
//
//  Set the recursion coefficients.
//
  for ( i = 1; i <= order; i++ )
  {
    if ( alpha + beta == 0.0 || beta - alpha == 0.0 )
    {
      b[i-1] = 0.0;
    }
    else
    {
      b[i-1] = ( alpha + beta ) * ( beta - alpha ) / 
             ( ( alpha + beta + double( 2 * i ) ) 
             * ( alpha + beta + double( 2 * i - 2 ) ) );
    }

    if ( i == 1 )
    {
      c[i-1] = 0.0;
    }
    else
    {
      c[i-1] = 4.0 * double( i - 1 ) 
         * ( alpha + double( i - 1 ) ) 
          * ( beta + double( i - 1 ) ) 
            * ( alpha + beta + double( i - 1 ) ) / 
            ( ( alpha + beta + double( 2 * i - 1 ) ) 
            * pow ( alpha + beta + double( 2 * i - 2 ), 2 ) 
            * ( alpha + beta + double( 2 * i - 3 ) ) );
    }
  }

  delta = exp ( lgamma ( alpha        + 1.0 ) 
              + lgamma (         beta + 1.0 ) 
              - lgamma ( alpha + beta + 2.0 ) );
  prod = 1.0;
  for ( i = 2; i <= order; i++ )
  {
    prod = prod * c[i-1];
  }
  cc = delta * pow ( 2.0, alpha + beta + 1.0 ) * prod;

  for ( i = 1; i <= order; i++ )
  {
    if ( i == 1 )
    {
      an = alpha / double( order );
      bn = beta / double( order );

      r1 = ( 1.0 + alpha ) 
        * ( 2.78 / ( 4.0 + double( order * order ) ) 
        + 0.768 * an / double( order ) );

      r2 = 1.0 + 1.48 * an + 0.96 * bn 
        + 0.452 * an * an + 0.83 * an * bn;

      x = ( r2 - r1 ) / r2;
    }
    else if ( i == 2 )
    {
      r1 = ( 4.1 + alpha ) / 
        ( ( 1.0 + alpha ) * ( 1.0 + 0.156 * alpha ) );

      r2 = 1.0 + 0.06 * ( double( order ) - 8.0 ) * 
        ( 1.0 + 0.12 * alpha ) / double( order );

      r3 = 1.0 + 0.012 * beta * 
        ( 1.0 + 0.25 * fabs ( alpha ) ) / double( order );

      x = x - r1 * r2 * r3 * ( 1.0 - x );
    }
    else if ( i == 3 )
    {
      r1 = ( 1.67 + 0.28 * alpha ) / ( 1.0 + 0.37 * alpha );

      r2 = 1.0 + 0.22 * ( double( order ) - 8.0 ) 
        / double( order );

      r3 = 1.0 + 8.0 * beta / 
        ( ( 6.28 + beta ) * double( order * order ) );

      x = x - r1 * r2 * r3 * ( xtab[0] - x );
    }
    else if ( i < order - 1 )
    {
      x = 3.0 * xtab[i-2] - 3.0 * xtab[i-3] + xtab[i-4];
    }
    else if ( i == order - 1 )
    {
      r1 = ( 1.0 + 0.235 * beta ) / ( 0.766 + 0.119 * beta );

      r2 = 1.0 / ( 1.0 + 0.639 
        * ( double( order ) - 4.0 ) 
        / ( 1.0 + 0.71 * ( double( order ) - 4.0 ) ) );

      r3 = 1.0 / ( 1.0 + 20.0 * alpha / ( ( 7.5 + alpha ) * 
        double( order * order ) ) );

      x = x + r1 * r2 * r3 * ( x - xtab[i-3] );
    }
    else if ( i == order )
    {
      r1 = ( 1.0 + 0.37 * beta ) / ( 1.67 + 0.28 * beta );

      r2 = 1.0 / 
        ( 1.0 + 0.22 * ( double( order ) - 8.0 ) 
        / double( order ) );

      r3 = 1.0 / ( 1.0 + 8.0 * alpha / 
        ( ( 6.28 + alpha ) * double( order * order ) ) );

      x = x + r1 * r2 * r3 * ( x - xtab[i-3] );
    }
    jacobi_ss_root ( &x, order, alpha, beta, &dp2, &p1, b, c );

    xtab[i-1] = x;
    weight[i-1] = cc / ( dp2 * p1 );
  }
//
//  Reverse the order of the values.
//
  r8vec_reverse ( order, xtab );
  r8vec_reverse ( order, weight );

  delete [] b;
  delete [] c;

  return;
}